

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGarbageQuadMesh
          (SceneGraph *this,int hash,size_t numQuads,bool mblur,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pQVar3;
  pointer pvVar4;
  Vec3fa *pVVar5;
  uint uVar6;
  undefined8 uVar7;
  uint uVar8;
  QuadMeshNode *this_00;
  long lVar9;
  Vec3fa *pVVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  size_t sVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  Ref<embree::SceneGraph::MaterialNode> local_48;
  undefined4 local_3c;
  Node *local_38;
  
  local_38 = (Node *)this;
  this_00 = (QuadMeshNode *)operator_new(0xd8);
  local_48 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  local_3c = (undefined4)CONCAT71(in_register_00000009,mblur);
  QuadMeshNode::QuadMeshNode(this_00,&local_48,(BBox1f)0x3f80000000000000,(ulong)mblur + 1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  std::
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ::resize(&this_00->quads,numQuads);
  uVar8 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
  uVar8 = (uVar8 * -0x194da000 | uVar8 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
  uVar8 = (uVar8 >> 0x10 ^ uVar8) * -0x7a143595;
  uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
  uVar8 = uVar8 >> 0x10 ^ uVar8;
  if (numQuads != 0) {
    lVar9 = 0;
    sVar15 = numQuads;
    do {
      uVar18 = uVar8 * 0x19660d + 0x3c6ef35f;
      uVar16 = uVar8 * 0x17385ca9 + 0x47502932;
      uVar6 = (uint)lVar9;
      uVar8 = uVar16;
      if ((uVar18 & 0x3e) != 0) {
        uVar16 = uVar6;
        uVar8 = uVar18;
      }
      uVar19 = uVar8 * 0x19660d + 0x3c6ef35f;
      uVar8 = uVar8 * 0x17385ca9 + 0x47502932;
      uVar18 = uVar6 + 1;
      if ((uVar19 & 0x3e) == 0) {
        uVar18 = uVar8;
        uVar19 = uVar8;
      }
      uVar20 = uVar19 * 0x19660d + 0x3c6ef35f;
      uVar8 = uVar19 * 0x17385ca9 + 0x47502932;
      uVar19 = uVar6 + 2;
      if ((uVar20 & 0x3e) == 0) {
        uVar19 = uVar8;
        uVar20 = uVar8;
      }
      uVar8 = uVar20 * 0x19660d + 0x3c6ef35f;
      uVar20 = uVar20 * 0x17385ca9 + 0x47502932;
      uVar6 = uVar6 + 3;
      if ((uVar8 & 0x3e) == 0) {
        uVar6 = uVar20;
        uVar8 = uVar20;
      }
      pQVar3 = (this_00->quads).
               super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (&pQVar3->v0)[lVar9] = uVar16;
      (&pQVar3->v1)[lVar9] = uVar18;
      (&pQVar3->v2)[lVar9] = uVar19;
      (&pQVar3->v3)[lVar9] = uVar6;
      lVar9 = lVar9 + 4;
      sVar15 = sVar15 - 1;
    } while (sVar15 != 0);
  }
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = numQuads << 2;
  uVar11 = pvVar4->size_alloced;
  uVar21 = uVar11;
  if ((uVar11 < uVar13) && (uVar21 = uVar13, uVar11 != 0)) {
    while (uVar21 = uVar11, uVar21 < uVar13) {
      uVar11 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0);
    }
  }
  if (uVar13 < pvVar4->size_active) {
    pvVar4->size_active = uVar13;
  }
  if (pvVar4->size_alloced == uVar21) {
    pvVar4->size_active = uVar13;
  }
  else {
    pVVar5 = pvVar4->items;
    pVVar10 = (Vec3fa *)alignedMalloc(uVar21 << 4,0x10);
    pvVar4->items = pVVar10;
    if (pvVar4->size_active != 0) {
      lVar9 = 0;
      uVar11 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pVVar5->field_0 + lVar9);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        uVar11 = uVar11 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar11 < pvVar4->size_active);
    }
    alignedFree(pVVar5);
    pvVar4->size_active = uVar13;
    pvVar4->size_alloced = uVar21;
  }
  if (uVar13 != 0) {
    lVar9 = 0;
    uVar11 = uVar13;
    do {
      iVar12 = uVar8 * 0x19660d;
      iVar14 = uVar8 * 0x17385ca9;
      iVar17 = uVar8 * -0x50b6f56b;
      uVar8 = uVar8 * 0x979e791 + 0xaaf95334;
      puVar1 = (undefined8 *)
               ((long)&((this_00->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar9);
      *puVar1 = CONCAT44(iVar14 + 0x47502932,iVar12 + 0x3c6ef35f);
      puVar1[1] = CONCAT44(uVar8,iVar17 + -0x2e330917);
      lVar9 = lVar9 + 0x10;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  if ((char)local_3c != '\0') {
    pvVar4 = (this_00->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = pvVar4[1].size_alloced;
    uVar21 = uVar11;
    if ((uVar11 < uVar13) && (uVar21 = uVar13, uVar11 != 0)) {
      while (uVar21 = uVar11, uVar21 < uVar13) {
        uVar11 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0);
      }
    }
    if (uVar13 < pvVar4[1].size_active) {
      pvVar4[1].size_active = uVar13;
    }
    if (pvVar4[1].size_alloced == uVar21) {
      pvVar4[1].size_active = uVar13;
    }
    else {
      pVVar5 = pvVar4[1].items;
      pVVar10 = (Vec3fa *)alignedMalloc(uVar21 << 4,0x10);
      pvVar4[1].items = pVVar10;
      if (pvVar4[1].size_active != 0) {
        lVar9 = 0;
        uVar11 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pVVar5->field_0 + lVar9);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)&(pvVar4[1].items)->field_0 + lVar9);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar11 < pvVar4[1].size_active);
      }
      alignedFree(pVVar5);
      pvVar4[1].size_active = uVar13;
      pvVar4[1].size_alloced = uVar21;
    }
    if (uVar13 != 0) {
      lVar9 = 0;
      do {
        iVar12 = uVar8 * 0x19660d;
        iVar14 = uVar8 * 0x17385ca9;
        iVar17 = uVar8 * -0x50b6f56b;
        uVar8 = uVar8 * 0x979e791 + 0xaaf95334;
        puVar1 = (undefined8 *)
                 ((long)&((this_00->positions).
                          super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].items)->field_0 + lVar9);
        *puVar1 = CONCAT44(iVar14 + 0x47502932,iVar12 + 0x3c6ef35f);
        puVar1[1] = CONCAT44(uVar8,iVar17 + -0x2e330917);
        lVar9 = lVar9 + 0x10;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
  }
  (local_38->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_38;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageQuadMesh (int hash, size_t numQuads, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),mblur?2:1);

    mesh->quads.resize(numQuads);
    for (size_t i=0; i<numQuads; i++) {
      const unsigned v0 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+0);
      const unsigned v1 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+1);
      const unsigned v2 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+2);
      const unsigned v3 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+3);
      mesh->quads[i] = QuadMeshNode::Quad(v0,v1,v2,v3);
    }

    mesh->positions[0].resize(4*numQuads);
    for (size_t i=0; i<4*numQuads; i++) {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float w = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0][i] = Vec3fa(Vec3ff(x,y,z,w));
    }

    if (mblur) 
    {
      mesh->positions[1].resize(4*numQuads);
      for (size_t i=0; i<4*numQuads; i++) {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float w = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1][i] = Vec3fa(Vec3ff(x,y,z,w));
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }